

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001796c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001796c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001796b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001796b8 = 0x2d2d2d2d2d2d2d;
    DAT_001796bf = 0x2d;
    _DAT_001796a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001796a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00179690 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000179698 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000179688 = 0x2d2d2d2d2d2d2d2d;
    DAT_001796cf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }